

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::FileDescriptor::Dump(FileDescriptor *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  uint *puVar3;
  char *pcVar4;
  unsigned_long_long *puVar5;
  UL *this_00;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  FileDescriptor *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  GenericDescriptor::Dump(&this->super_GenericDescriptor,(FILE *)identbuf._120_8_);
  bVar2 = optional_property<unsigned_int>::empty(&this->LinkedTrackID);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    puVar3 = optional_property<unsigned_int>::get(&this->LinkedTrackID);
    fprintf((FILE *)uVar1,"  %22s = %d\n","LinkedTrackID",(ulong)*puVar3);
  }
  uVar1 = identbuf._120_8_;
  pcVar4 = Rational::EncodeString(&this->SampleRate,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","SampleRate",pcVar4);
  bVar2 = optional_property<unsigned_long_long>::empty(&this->ContainerDuration);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    puVar5 = optional_property<unsigned_long_long>::get(&this->ContainerDuration);
    pcVar4 = i64sz(*puVar5,local_98);
    fprintf((FILE *)uVar1,"  %22s = %s\n","ContainerDuration",pcVar4);
  }
  uVar1 = identbuf._120_8_;
  pcVar4 = UL::EncodeString(&this->EssenceContainer,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","EssenceContainer",pcVar4);
  bVar2 = optional_property<ASDCP::UL>::empty(&this->Codec);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_00 = optional_property<ASDCP::UL>::get(&this->Codec);
    pcVar4 = UL::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","Codec",pcVar4);
  }
  return;
}

Assistant:

void
FileDescriptor::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericDescriptor::Dump(stream);
  if ( ! LinkedTrackID.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "LinkedTrackID", LinkedTrackID.get());
  }
  fprintf(stream, "  %22s = %s\n",  "SampleRate", SampleRate.EncodeString(identbuf, IdentBufferLen));
  if ( ! ContainerDuration.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "ContainerDuration", i64sz(ContainerDuration.get(), identbuf));
  }
  fprintf(stream, "  %22s = %s\n",  "EssenceContainer", EssenceContainer.EncodeString(identbuf, IdentBufferLen));
  if ( ! Codec.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Codec", Codec.get().EncodeString(identbuf, IdentBufferLen));
  }
}